

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::logMessage(Federate *this,int level,string_view message)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool bVar1;
  element_type *peVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  size_t in_RCX;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  uint in_ESI;
  long in_RDI;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x18));
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x31595c);
    (*peVar2->_vptr_Core[0x53])(peVar2,(ulong)*(uint *)(in_RDI + 0x10),(ulong)in_ESI,in_RDX,in_RCX);
  }
  else if ((int)in_ESI < 4) {
    __str._M_str = (char *)in_RDX;
    __str._M_len = in_stack_ffffffffffffffb8;
    pbVar3 = std::operator<<(in_stack_ffffffffffffffb0,__str);
    std::operator<<((ostream *)pbVar3,'\n');
  }
  else {
    __str_00._M_str = in_stack_ffffffffffffffc0;
    __str_00._M_len = in_RCX;
    pbVar3 = std::operator<<(in_RDX,__str_00);
    std::operator<<((ostream *)pbVar3,'\n');
  }
  return;
}

Assistant:

void Federate::logMessage(int level, std::string_view message) const
{
    if (coreObject) {
        coreObject->logMessage(fedID, level, message);
    } else if (level <= HELICS_LOG_LEVEL_WARNING) {
        std::cerr << message << '\n';
    } else {
        std::cout << message << '\n';
    }
}